

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int BIO_free(BIO *a)

{
  int iVar1;
  BIO *pBVar2;
  BIO *next_bio;
  BIO *bio_local;
  
  next_bio = (BIO *)a;
  while( true ) {
    if (next_bio == (BIO *)0x0) {
      return 1;
    }
    iVar1 = CRYPTO_refcount_dec_and_test_zero(&next_bio->references);
    if (iVar1 == 0) break;
    pBVar2 = BIO_pop((BIO *)next_bio);
    if ((next_bio->method != (BIO_METHOD *)0x0) &&
       (next_bio->method->destroy != (_func_int_BIO_ptr *)0x0)) {
      (*next_bio->method->destroy)(next_bio);
    }
    CRYPTO_free_ex_data(0x2d3848,next_bio,(CRYPTO_EX_DATA *)&next_bio->ex_data);
    OPENSSL_free(next_bio);
    next_bio = (BIO *)pBVar2;
  }
  return 0;
}

Assistant:

int BIO_free(BIO *bio) {
  BIO *next_bio;

  for (; bio != NULL; bio = next_bio) {
    if (!CRYPTO_refcount_dec_and_test_zero(&bio->references)) {
      return 0;
    }

    next_bio = BIO_pop(bio);

    if (bio->method != NULL && bio->method->destroy != NULL) {
      bio->method->destroy(bio);
    }

    CRYPTO_free_ex_data(&g_ex_data_class, bio, &bio->ex_data);
    OPENSSL_free(bio);
  }
  return 1;
}